

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O1

PageSegmentBase<Memory::VirtualAllocWrapper> * __thiscall
DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,RealCount>::
PrependNode<Memory::NoThrowHeapAllocator,Memory::PageAllocatorBase<Memory::VirtualAllocWrapper,Memory::SegmentBase<Memory::VirtualAllocWrapper>,Memory::PageSegmentBase<Memory::VirtualAllocWrapper>>*,void*,unsigned_int,unsigned_int,bool>
          (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,RealCount> *this,
          NoThrowHeapAllocator *allocator,
          PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
          *param1,void *param2,uint param3,uint param4,bool param5)

{
  long lVar1;
  NoThrowHeapAllocator *this_00;
  long *plVar2;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  local_68 = (undefined1  [8])
             &DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_121099;
  data.filename._0_4_ = 0x14b;
  data._32_8_ = param2;
  this_00 = Memory::NoThrowHeapAllocator::TrackAllocInfo(allocator,(TrackAllocData *)local_68);
  plVar2 = (long *)Memory::NoThrowHeapAllocator::Alloc(this_00,0x98);
  Memory::PageSegmentBase<Memory::VirtualAllocWrapper>::PageSegmentBase
            ((PageSegmentBase<Memory::VirtualAllocWrapper> *)(plVar2 + 2),param1,(void *)data._32_8_
             ,param3,param4,param5);
  lVar1 = *(long *)this;
  plVar2[1] = *(long *)(lVar1 + 8);
  *plVar2 = lVar1;
  **(undefined8 **)(lVar1 + 8) = plVar2;
  *(long **)(lVar1 + 8) = plVar2;
  *(int *)(this + 0x10) = *(int *)(this + 0x10) + 1;
  return (PageSegmentBase<Memory::VirtualAllocWrapper> *)(plVar2 + 2);
}

Assistant:

TData * PrependNode(TAllocator * allocator, TParam1 param1, TParam2 param2, TParam3 param3, TParam4 param4, TParam5 param5)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, param1, param2, param3, param4, param5);
        if (newNode)
        {
            DListBase::InsertNodeBefore(this->Next(), newNode);
            this->IncrementCount();
            return &newNode->data;
        }
        return nullptr;
    }